

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String __thiscall Bstrlib::String::normalizedPath(String *this,char sep,bool includeLastSep)

{
  byte in_CL;
  uchar *extraout_RDX;
  undefined7 in_register_00000031;
  bool bVar2;
  String SVar3;
  String local_30;
  int local_20;
  byte local_1a;
  undefined1 local_19;
  int rightLimit;
  bool includeLastSep_local;
  char sep_local;
  String *this_local;
  uchar *puVar1;
  
  _rightLimit = CONCAT71(in_register_00000031,sep);
  local_1a = in_CL & 1;
  local_20 = *(int *)(_rightLimit + 4);
  do {
    local_20 = local_20 + -1;
    bVar2 = false;
    if (-1 < local_20) {
      bVar2 = (uint)*(byte *)(*(long *)(_rightLimit + 8) + (long)local_20) == (int)includeLastSep;
    }
  } while (bVar2);
  bVar2 = false;
  local_19 = includeLastSep;
  this_local = this;
  if ((local_1a == 0) && (-1 < local_20)) {
    SVar3 = midString(this,(int)_rightLimit,0);
    puVar1 = SVar3.super_tagbstring.data;
  }
  else {
    midString(&local_30,(int)_rightLimit,0);
    bVar2 = true;
    SVar3 = operator+(this,(char)&local_30);
    puVar1 = SVar3.super_tagbstring.data;
  }
  if (bVar2) {
    ~String(&local_30);
    puVar1 = extraout_RDX;
  }
  SVar3.super_tagbstring.data = puVar1;
  SVar3.super_tagbstring._0_8_ = this;
  return (String)SVar3.super_tagbstring;
}

Assistant:

String String::normalizedPath(char sep, const bool includeLastSep) const
    {
        int rightLimit = slen - 1;
        while (rightLimit >= 0 && data[rightLimit] == sep) rightLimit--;
        return includeLastSep || rightLimit < 0 ? midString(0, rightLimit+1) + sep : midString(0, rightLimit+1);
    }